

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

bool __thiscall
ICM::Compiler::InstructionCreater::createNodeLoop
          (InstructionCreater *this,Node *node,Element *refelt)

{
  Element *this_00;
  reference element;
  size_t sVar1;
  Jump *this_01;
  Jump *jpinst;
  size_t index;
  Element *Rdo;
  Element *local_20;
  Element *refelt_local;
  Node *node_local;
  InstructionCreater *this_local;
  
  local_20 = refelt;
  refelt_local = (Element *)node;
  node_local = (Node *)this;
  Rdo = (Element *)ASTBase::Node::getIndex(node);
  std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::push
            (&this->LoopBreakIDs,(value_type *)&Rdo);
  element = std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>::operator[]
                      ((vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_> *)
                       refelt_local,1);
  sVar1 = NextInstID(this);
  createReferNode(this,element);
  this_01 = (Jump *)operator_new(0x18);
  (this_01->super_InstDataBase<(ICM::Instruction::Instruction)30>).super_InstructionData.
  _vptr_InstructionData = (_func_int **)0x0;
  *(undefined8 *)
   &(this_01->super_InstDataBase<(ICM::Instruction::Instruction)30>).super_InstructionData.Inst = 0;
  this_01->Index = 0;
  Instruction::Insts::Jump::Jump(this_01);
  Instruction::InstructionList::push(&this->InstList,(InstructionData *)this_01);
  this_01->Index = sVar1;
  Instruction::InstructionList::push(&this->InstList,nop);
  this_00 = local_20;
  sVar1 = CurrInstID(this);
  ASTBase::Element::setRefer(this_00,sVar1);
  sVar1 = ASTBase::Element::getRefer(local_20);
  adjustLoopBreakJump(this,sVar1);
  std::stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::pop
            (&this->LoopBreakIDs);
  return true;
}

Assistant:

bool createNodeLoop(Node &node, Element &refelt) {
				LoopBreakIDs.push(node.getIndex());
				Element &Rdo = node[1];
				size_t index = NextInstID();
				createReferNode(Rdo);
				auto *jpinst = new Insts::Jump();
				InstList.push(jpinst);
				jpinst->Index = index;
				InstList.push(nop);

				refelt.setRefer(CurrInstID());
				adjustLoopBreakJump(refelt.getRefer());
				LoopBreakIDs.pop();
				return true;
			}